

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O0

bool __thiscall
Omega_h::CmdLineFlag::parse_impl(CmdLineFlag *this,int *p_argc,char **argv,int i,bool should_print)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  ostream *poVar4;
  string *psVar5;
  reference this_00;
  pointer pCVar6;
  unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_> *the_arg;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
  *__range1;
  bool should_print_local;
  int i_local;
  char **argv_local;
  int *p_argc_local;
  CmdLineFlag *this_local;
  
  shift(p_argc,argv,i);
  iVar1 = *p_argc;
  sVar3 = std::
          vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
          ::size(&this->args_);
  if (iVar1 - i < (int)sVar3) {
    if (should_print) {
      poVar4 = std::operator<<((ostream *)&std::cout,"flag ");
      psVar5 = CmdLineItem::name_abi_cxx11_(&this->super_CmdLineItem);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      poVar4 = std::operator<<(poVar4," takes ");
      sVar3 = std::
              vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
              ::size(&this->args_);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
      std::operator<<(poVar4," arguments\n");
    }
    this_local._7_1_ = false;
  }
  else {
    __end1 = std::
             vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
             ::begin(&this->args_);
    the_arg = (unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_> *)
              std::
              vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>
              ::end(&this->args_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_*,_std::vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>_>
                                       *)&the_arg), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_*,_std::vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>_>
                ::operator*(&__end1);
      pCVar6 = std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>::
               operator->(this_00);
      bVar2 = CmdLineItem::parse(pCVar6,p_argc,argv,i,should_print);
      if (!bVar2) {
        if (should_print) {
          poVar4 = std::operator<<((ostream *)&std::cout,"could not parse argument <");
          pCVar6 = std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>
                   ::operator->(this_00);
          psVar5 = CmdLineItem::name_abi_cxx11_(pCVar6);
          poVar4 = std::operator<<(poVar4,(string *)psVar5);
          poVar4 = std::operator<<(poVar4,"> of flag ");
          psVar5 = CmdLineItem::name_abi_cxx11_(&this->super_CmdLineItem);
          poVar4 = std::operator<<(poVar4,(string *)psVar5);
          std::operator<<(poVar4,'\n');
        }
        return false;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_*,_std::vector<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>,_std::allocator<std::unique_ptr<Omega_h::CmdLineItem,_std::default_delete<Omega_h::CmdLineItem>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CmdLineFlag::parse_impl(
    int* p_argc, char** argv, int i, bool should_print) {
  shift(p_argc, argv, i);
  if (((*p_argc) - i) < int(args_.size())) {
    if (should_print) {
      std::cout << "flag " << name() << " takes " << args_.size()
                << " arguments\n";
    }
    return false;
  }
  for (auto const& the_arg : args_) {
    if (!the_arg->parse(p_argc, argv, i, should_print)) {
      if (should_print) {
        std::cout << "could not parse argument <" << the_arg->name()
                  << "> of flag " << name() << '\n';
      }
      return false;
    }
  }
  return true;
}